

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::
     _parse<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
               (default_parse_context *ctx,
               input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in_00;
  FILE *__stream_00;
  double f;
  string num_str;
  char *endp;
  
  __stream_00 = (FILE *)in;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::skip_ws(in);
  iVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                    (in,__stream_00);
  if (iVar2 == 0x22) {
    bVar1 = default_parse_context::
            parse_string<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>(ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x5b) {
    bVar1 = _parse_array<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                      (ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x66) {
    std::__cxx11::string::string((string *)&num_str,"alse",(allocator *)&endp);
    bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                      (in,&num_str);
    if (!bVar1) goto LAB_0018352e;
    bVar1 = default_parse_context::set_bool(ctx,false);
  }
  else {
    if (iVar2 == 0x7b) {
      bVar1 = _parse_object<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                        (ctx,in);
      return bVar1;
    }
    if (iVar2 == 0x74) {
      std::__cxx11::string::string((string *)&num_str,"rue",(allocator *)&endp);
      bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                        (in,&num_str);
      if (!bVar1) goto LAB_0018352e;
      bVar1 = default_parse_context::set_bool(ctx,true);
    }
    else {
      if (iVar2 != 0x6e) {
        if (iVar2 != 0x2d && 9 < iVar2 - 0x30U) {
          input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                    (in,(int)__stream_00,__stream);
          return false;
        }
        input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                  (in,(int)__stream_00,__stream);
        _parse_number<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                  (&num_str,(picojson *)in,in_00);
        if ((num_str._M_string_length == 0) ||
           (f = strtod(num_str._M_dataplus._M_p,&endp),
           endp != num_str._M_dataplus._M_p + num_str._M_string_length)) {
          bVar1 = false;
        }
        else {
          bVar1 = true;
          default_parse_context::set_number(ctx,f);
        }
        std::__cxx11::string::~string((string *)&num_str);
        return bVar1;
      }
      std::__cxx11::string::string((string *)&num_str,"ull",(allocator *)&endp);
      bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                        (in,&num_str);
      if (!bVar1) {
LAB_0018352e:
        std::__cxx11::string::~string((string *)&num_str);
        return false;
      }
      bVar1 = default_parse_context::set_null(ctx);
    }
  }
  std::__cxx11::string::~string((string *)&num_str);
  if (bVar1 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool _parse(Context& ctx, input<Iter>& in) {
    in.skip_ws();
    int ch = in.getc();
    switch (ch) {
#define IS(ch, text, op) case ch: \
      if (in.match(text) && op) { \
	return true; \
      } else { \
	return false; \
      }
      IS('n', "ull", ctx.set_null());
      IS('f', "alse", ctx.set_bool(false));
      IS('t', "rue", ctx.set_bool(true));
#undef IS
    case '"':
      return ctx.parse_string(in);
    case '[':
      return _parse_array(ctx, in);
    case '{':
      return _parse_object(ctx, in);
    default:
      if (('0' <= ch && ch <= '9') || ch == '-') {
        double f;
        char *endp;
	in.ungetc();
        std::string num_str = _parse_number(in);
        if (num_str.empty()) {
          return false;
        }
#ifdef PICOJSON_USE_INT64
        {
          errno = 0;
          intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
          if (errno == 0
              && std::numeric_limits<int64_t>::min() <= ival
              && ival <= std::numeric_limits<int64_t>::max()
              && endp == num_str.c_str() + num_str.size()) {
            ctx.set_int64(ival);
            return true;
          }
        }
#endif
        f = strtod(num_str.c_str(), &endp);
        if (endp == num_str.c_str() + num_str.size()) {
          ctx.set_number(f);
          return true;
        }
        return false;
      }
      break;
    }
    in.ungetc();
    return false;
  }